

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rtree.cpp
# Opt level: O0

bool ON_SubDRTreeVertexFinder::Callback(void *a_context,ON__INT_PTR a_id)

{
  double *pdVar1;
  byte bVar2;
  char cVar3;
  ON_SubDVertex *this;
  bool bVar4;
  double dVar5;
  ON_3dPoint local_70;
  ON_3dVector local_58;
  double d;
  ON_SubDVertex *pOStack_30;
  ON__UINT8 v_mark_bits;
  ON_SubDVertex *v;
  ON_SubDRTreeVertexFinder *vf;
  ON__INT_PTR a_id_local;
  void *a_context_local;
  
  if (a_id == 0) {
    return true;
  }
  pOStack_30 = (ON_SubDVertex *)a_id;
  v = (ON_SubDVertex *)a_context;
  vf = (ON_SubDRTreeVertexFinder *)a_id;
  a_id_local = (ON__INT_PTR)a_context;
  if (((*(byte *)((long)a_context + 0x28) & 1) != 0) &&
     (bVar2 = *(byte *)((long)a_context + 0x29),
     bVar4 = ON_SubDComponentBase::Mark((ON_SubDComponentBase *)a_id), (bool)(bVar2 & 1) != bVar4))
  {
    return true;
  }
  if (*(char *)((long)(v->super_ON_SubDComponentBase).m_saved_subd_point1 + 0x12) != '\0') {
    d._7_1_ = ON_SubDComponentBase::MarkBits(&pOStack_30->super_ON_SubDComponentBase);
    cVar3 = *(char *)((long)(v->super_ON_SubDComponentBase).m_saved_subd_point1 + 0x12);
    if (cVar3 == '\x01') {
      if (*(ON__UINT8 *)((long)(v->super_ON_SubDComponentBase).m_saved_subd_point1 + 0x13) !=
          d._7_1_) {
        return true;
      }
    }
    else if ((cVar3 == '\x02') &&
            (*(ON__UINT8 *)((long)(v->super_ON_SubDComponentBase).m_saved_subd_point1 + 0x13) ==
             d._7_1_)) {
      return true;
    }
  }
  this = v;
  ON_SubDVertex::ControlNetPoint(&local_70,pOStack_30);
  ON_3dPoint::operator-(&local_58,(ON_3dPoint *)this,&local_70);
  dVar5 = ON_3dVector::MaximumCoordinate(&local_58);
  if (dVar5 < 0.0) {
    return true;
  }
  if ((v->super_ON_SubDComponentBase).m_saved_subd_point1[1] == 0.0) {
    (v->super_ON_SubDComponentBase).m_saved_subd_point1[1] = (double)pOStack_30;
    (v->super_ON_SubDComponentBase).m_saved_subd_point1[0] = dVar5;
  }
  else {
    if ((v->super_ON_SubDComponentBase).m_saved_subd_point1[0] <= dVar5) {
      pdVar1 = (v->super_ON_SubDComponentBase).m_saved_subd_point1;
      if (((dVar5 != *pdVar1) || (NAN(dVar5) || NAN(*pdVar1))) ||
         (*(uint *)((long)(v->super_ON_SubDComponentBase).m_saved_subd_point1[1] + 8) <=
          (pOStack_30->super_ON_SubDComponentBase).m_id)) goto LAB_0082e1d8;
    }
    (v->super_ON_SubDComponentBase).m_saved_subd_point1[1] = (double)pOStack_30;
    (v->super_ON_SubDComponentBase).m_saved_subd_point1[0] = dVar5;
  }
LAB_0082e1d8:
  if ((dVar5 == 0.0) && (!NAN(dVar5))) {
    return false;
  }
  return true;
}

Assistant:

bool ON_SubDRTreeVertexFinder::Callback(void* a_context, ON__INT_PTR a_id)
{
  for (;;)
  {
    ON_SubDRTreeVertexFinder* vf = (ON_SubDRTreeVertexFinder*)a_context;
    const ON_SubDVertex* v = (const ON_SubDVertex*)a_id;
    if (nullptr == v )
      break;

    if (vf->m_bMarkFilterEnabled && vf->m_bMarkFilter != v->Mark())
    {
      // v is not eligible.
      // Returning true means continue searching for other vertices
      return true;
    }

    if (ON_SubDRTreeVertexFinder::MarkBitsFilter::None != vf->m_mark_bits_filter)
    {
      const ON__UINT8 v_mark_bits = v->MarkBits();
      switch(vf->m_mark_bits_filter)
      {
      case ON_SubDRTreeVertexFinder::MarkBitsFilter::Equal:
        if (vf->m_mark_bits != v_mark_bits)
        {
          // v is not eligible.
          // Returning true means continue searching for other vertices
          return true;
        }
        break;

      case ON_SubDRTreeVertexFinder::MarkBitsFilter::NotEqual:
        if (vf->m_mark_bits == v_mark_bits)
        {
          // v is not eligible.
          // Returning true means continue searching for other vertices
          return true;
        }
        break;

      default:
        break;
      }
    }

    const double d = (vf->m_P - v->ControlNetPoint()).MaximumCoordinate();
    if (d >= 0.0)
    {
      if (nullptr == vf->m_v)
      {
        vf->m_v = v;
        vf->m_distance = d;
      }
      else
      {
        if (d < vf->m_distance || (d == vf->m_distance && v->m_id < vf->m_v->m_id))
        {
          vf->m_v = v;
          vf->m_distance = d;
        }
      }
      if (0.0 == d)
        return false; // can't get any closer. Stop searching.
    }
    break;
  }
  return true;
}